

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O0

void c352_w(void *chip,UINT16 address,UINT16 val)

{
  int local_24;
  int i;
  C352 *c;
  UINT16 val_local;
  UINT16 address_local;
  void *chip_local;
  
  if (address < 0x100) {
    *(UINT16 *)
     ((long)chip +
     (long)(int)(uint)C352RegMap[(int)((uint)address % 8)] * 2 +
     (long)(int)(address / 8) * 0x24 + 0xc) = val;
  }
  else if (address == 0x200) {
    *(UINT16 *)((long)chip + 0x48e) = val;
  }
  else if (address == 0x202) {
    for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
      if ((*(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) & 0x4000) == 0) {
        if ((*(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) & 0x2000) != 0) {
          *(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) =
               *(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) & 0x5fff;
          *(undefined4 *)((long)chip + (long)local_24 * 0x24 + 0x10) = 0xffff;
        }
      }
      else {
        *(uint *)((long)chip + (long)local_24 * 0x24 + 0xc) =
             CONCAT22(*(undefined2 *)((long)chip + (long)local_24 * 0x24 + 0x24),
                      *(undefined2 *)((long)chip + (long)local_24 * 0x24 + 0x26));
        *(undefined2 *)((long)chip + (long)local_24 * 0x24 + 0x14) = 0;
        *(undefined2 *)((long)chip + (long)local_24 * 0x24 + 0x16) = 0;
        *(undefined4 *)((long)chip + (long)local_24 * 0x24 + 0x10) = 0xffff;
        *(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) =
             *(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) | 0x8000;
        *(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) =
             *(ushort *)((long)chip + (long)local_24 * 0x24 + 0x22) & 0xb7ff;
        *(undefined1 *)((long)chip + (long)local_24 * 0x24 + 0x1d) = 0;
        *(undefined1 *)((long)chip + (long)local_24 * 0x24 + 0x1c) = 0;
        *(undefined1 *)((long)chip + (long)local_24 * 0x24 + 0x1f) = 0;
        *(undefined1 *)((long)chip + (long)local_24 * 0x24 + 0x1e) = 0;
      }
    }
  }
  return;
}

Assistant:

static void c352_w(void *chip, UINT16 address, UINT16 val)
{
	C352 *c = (C352 *)chip;
	
	int i;
	
	if(address < 0x100) // Channel registers, see map above.
	{
		*((UINT16*)&c->v[address/8]+C352RegMap[address%8]) = val;
	}
	else if(address == 0x200)
	{
		c->control = val;
		//logerror("C352 control register write: %04x\n",val);
	}
	else if(address == 0x202) // execute keyons/keyoffs
	{
		for(i=0;i<C352_VOICES;i++)
		{
			if((c->v[i].flags & C352_FLG_KEYON))
			{
				c->v[i].pos = (c->v[i].wave_bank<<16) | c->v[i].wave_start;

				c->v[i].sample = 0;
				c->v[i].last_sample = 0;
				c->v[i].counter = 0xffff;

				c->v[i].flags |= C352_FLG_BUSY;
				c->v[i].flags &= ~(C352_FLG_KEYON|C352_FLG_LOOPHIST);

				c->v[i].curr_vol[0] = c->v[i].curr_vol[1] = 0;
				c->v[i].curr_vol[2] = c->v[i].curr_vol[3] = 0;
			}
			else if(c->v[i].flags & C352_FLG_KEYOFF)
			{
				c->v[i].flags &= ~(C352_FLG_BUSY|C352_FLG_KEYOFF);
				c->v[i].counter = 0xffff;
			}
		}
	}
}